

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O3

int cuddNodeArrayRecur(DdNode *f,DdNodePtr *table,int index)

{
  int index_00;
  
  if (((ulong)f->next & 1) != 0) {
    f->next = (DdNode *)((ulong)f->next & 0xfffffffffffffffe);
    if (f->index != 0x7fffffff) {
      index_00 = cuddNodeArrayRecur((f->type).kids.T,table,index);
      index = cuddNodeArrayRecur((DdNode *)((ulong)(f->type).kids.E & 0xfffffffffffffffe),table,
                                 index_00);
    }
    table[index] = f;
    index = index + 1;
  }
  return index;
}

Assistant:

static int
cuddNodeArrayRecur(
  DdNode *f,
  DdNodePtr *table,
  int index)
{
    int tindex, eindex;

    if (!Cudd_IsComplement(f->next)) {
        return(index);
    }
    /* Clear visited flag. */
    f->next = Cudd_Regular(f->next);
    if (cuddIsConstant(f)) {
        table[index] = f;
        return(index + 1);
    }
    tindex = cuddNodeArrayRecur(cuddT(f), table, index);
    eindex = cuddNodeArrayRecur(Cudd_Regular(cuddE(f)), table, tindex);
    table[eindex] = f;
    return(eindex + 1);

}